

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int send_certificate_and_certificate_verify
              (ptls_t *tls,ptls_message_emitter_t *emitter,
              st_ptls_signature_algorithms_t *signature_algorithms,ptls_iovec_t context,
              char *context_string,int push_status_request)

{
  _func_ptls_private_key_result_t_ptls_sign_certificate_t_ptr_ptls_t_ptr_uint16_t_ptr_ptls_buffer_t_ptr_ptls_iovec_t_uint16_t_ptr_size_t
  *p_Var1;
  ptls_sign_certificate_t *ppVar2;
  _func_int_st_ptls_sign_certificate_t_ptr_ptls_t_ptr_uint16_t_ptr_ptls_buffer_t_ptr_ptls_iovec_t_uint16_t_ptr_size_t
  *p_Var3;
  st_ptls_sign_certificate_t *psVar4;
  long lVar5;
  size_t sVar6;
  int iVar7;
  size_t len;
  ptls_iovec_t pVar8;
  ptls_emit_certificate_t *local_338;
  size_t body_size_2;
  size_t body_size_3;
  size_t datalen;
  uint8_t data [226];
  uint16_t algo_1;
  size_t body_start_3;
  size_t capacity_3;
  size_t sStack_208;
  uint16_t _v_1;
  size_t algo_off_1;
  ptls_buffer_t *sendbuf_1;
  size_t body_start_2;
  size_t capacity_2;
  size_t local_1e0;
  size_t mess_start_1;
  ptls_key_schedule_t *_key_sched_1;
  ptls_buffer_t *_buf_1;
  ptls_message_emitter_t *_emitter_1;
  size_t body_size;
  size_t body_size_1;
  size_t body_start_1;
  size_t capacity_1;
  size_t sStack_198;
  uint16_t _v;
  size_t siglen;
  size_t algo_off;
  ptls_buffer_t *sendbuf;
  size_t body_start;
  size_t capacity;
  size_t local_168;
  size_t mess_start;
  ptls_key_schedule_t *_key_sched;
  ptls_buffer_t *_buf;
  ptls_message_emitter_t *_emitter;
  uint16_t local_136;
  ptls_private_key_result_t local_134;
  uint16_t algo;
  size_t sStack_130;
  ptls_private_key_result_t res;
  size_t handshake_len;
  uint8_t handshake_data [226];
  int ret;
  ptls_emit_certificate_t *emit_certificate;
  char *context_string_local;
  st_ptls_signature_algorithms_t *signature_algorithms_local;
  ptls_message_emitter_t *emitter_local;
  ptls_t *tls_local;
  ptls_iovec_t context_local;
  
  if (tls->ctx->emit_certificate == (ptls_emit_certificate_t *)0x0) {
    local_338 = &send_certificate_and_certificate_verify::default_emit_certificate;
  }
  else {
    local_338 = tls->ctx->emit_certificate;
  }
  stack0xffffffffffffffc0 = local_338;
  msg("send_certificate_and_certificate_verify");
  if (((byte)tls->field_0x160 >> 5 & 1) == 0) {
    if (signature_algorithms->count == 0) {
      return 0x6d;
    }
    handshake_data._220_4_ =
         (*stack0xffffffffffffffc0->cb)
                   (stack0xffffffffffffffc0,tls,emitter,tls->key_schedule,context,
                    push_status_request);
    if (handshake_data._220_4_ != 0) {
      return handshake_data._220_4_;
    }
    if (tls->ctx->sign_certificate == (ptls_sign_certificate_t *)0x0) {
      return 0;
    }
    if ((tls->ctx->private_key_method == (ptls_private_key_method_t *)0x0) ||
       ((tls->field_0x160 & 1) == 0)) {
      _buf_1 = (ptls_buffer_t *)emitter;
      handshake_data._220_4_ = (*emitter->begin_message)(emitter);
      if (handshake_data._220_4_ != 0) {
        return handshake_data._220_4_;
      }
      _key_sched_1 = (ptls_key_schedule_t *)_buf_1->base;
      mess_start_1 = (size_t)tls->key_schedule;
      local_1e0 = *(size_t *)_key_sched_1->secret;
      capacity_2._7_1_ = 0xf;
      handshake_data._220_4_ =
           ptls_buffer__do_pushv((ptls_buffer_t *)_key_sched_1,(void *)((long)&capacity_2 + 7),1);
      if (handshake_data._220_4_ != 0) {
        return handshake_data._220_4_;
      }
      body_start_2 = 3;
      handshake_data._220_4_ = ptls_buffer__do_pushv((ptls_buffer_t *)_key_sched_1,"",3);
      if (handshake_data._220_4_ != 0) {
        return handshake_data._220_4_;
      }
      sendbuf_1 = *(ptls_buffer_t **)_key_sched_1->secret;
      algo_off_1 = (size_t)emitter->buf;
      sStack_208 = ((ptls_buffer_t *)algo_off_1)->off;
      capacity_3._6_2_ = 0;
      capacity_3._4_1_ = 0;
      capacity_3._5_1_ = 0;
      handshake_data._220_4_ =
           ptls_buffer__do_pushv((ptls_buffer_t *)algo_off_1,(void *)((long)&capacity_3 + 4),2);
      if (handshake_data._220_4_ != 0) {
        return handshake_data._220_4_;
      }
      body_start_3 = 2;
      handshake_data._220_4_ = ptls_buffer__do_pushv((ptls_buffer_t *)algo_off_1,"",2);
      if (handshake_data._220_4_ != 0) {
        return handshake_data._220_4_;
      }
      unique0x00012000 = *(long *)(algo_off_1 + 0x10);
      len = build_certificate_verify_signdata((uint8_t *)&datalen,tls->key_schedule,context_string);
      sVar6 = algo_off_1;
      p_Var3 = tls->ctx->sign_certificate->cb;
      psVar4 = tls->ctx->sign_certificate;
      pVar8 = ptls_iovec_init(&datalen,len);
      handshake_data._220_4_ =
           (*p_Var3)(psVar4,tls,(uint16_t *)(data + 0xde),(ptls_buffer_t *)sVar6,pVar8,
                     signature_algorithms->list,signature_algorithms->count);
      if (handshake_data._220_4_ != 0) {
        return handshake_data._220_4_;
      }
      *(uint8_t *)(*(long *)algo_off_1 + sStack_208) = SUB21(data._222_2_,1);
      *(uint8_t *)(*(long *)algo_off_1 + 1 + sStack_208) = (uint8_t)data._222_2_;
      lVar5 = *(long *)(algo_off_1 + 0x10);
      for (; body_start_3 != 0; body_start_3 = body_start_3 - 1) {
        *(char *)(*(long *)algo_off_1 + (stack0xfffffffffffffde0 - body_start_3)) =
             (char)((ulong)(lVar5 - stack0xfffffffffffffde0) >>
                   (((char)body_start_3 + -1) * '\b' & 0x3fU));
      }
      lVar5 = *(long *)_key_sched_1->secret;
      for (; body_start_2 != 0; body_start_2 = body_start_2 - 1) {
        *(char *)((long)sendbuf_1 + (*(long *)_key_sched_1 - body_start_2)) =
             (char)((ulong)(lVar5 - (long)sendbuf_1) >> (((char)body_start_2 + -1) * '\b' & 0x3fU));
      }
      if (mess_start_1 != 0) {
        ptls__key_schedule_update_hash
                  ((ptls_key_schedule_t *)mess_start_1,
                   (uint8_t *)(*(long *)_key_sched_1 + local_1e0),
                   *(long *)_key_sched_1->secret - local_1e0);
      }
      iVar7 = (*(code *)_buf_1[1].base)(_buf_1);
      return iVar7;
    }
    sStack_130 = 0;
    if (((byte)tls->field_0x160 >> 5 & 1) == 0) {
      ptls_buffer_init(&tls->handshake_buf,"",0);
      sStack_130 = build_certificate_verify_signdata
                             ((uint8_t *)&handshake_len,tls->key_schedule,context_string);
    }
    if (((byte)tls->field_0x160 >> 5 & 1) == 0) {
      p_Var1 = tls->ctx->private_key_method->sign;
      ppVar2 = tls->ctx->sign_certificate;
      __emitter = ptls_iovec_init(&handshake_len,sStack_130);
      local_134 = (*p_Var1)(ppVar2,tls,&local_136,&tls->handshake_buf,__emitter,
                            signature_algorithms->list,signature_algorithms->count);
      goto LAB_0012863b;
    }
  }
  local_134 = (*tls->ctx->private_key_method->complete)
                        (tls->ctx->sign_certificate,tls,&local_136,&tls->handshake_buf);
LAB_0012863b:
  if (local_134 == ptls_private_key_success) {
    msg("Completed private_key_method");
    handshake_data[0xdc] = '\0';
    handshake_data[0xdd] = '\0';
    handshake_data[0xde] = '\0';
    handshake_data[0xdf] = '\0';
    tls->field_0x160 = tls->field_0x160 & 0xdf;
    _buf = (ptls_buffer_t *)emitter;
    handshake_data._220_4_ = (*emitter->begin_message)(emitter);
    if (handshake_data._220_4_ == 0) {
      _key_sched = (ptls_key_schedule_t *)_buf->base;
      mess_start = (size_t)tls->key_schedule;
      local_168 = *(size_t *)_key_sched->secret;
      capacity._7_1_ = 0xf;
      handshake_data._220_4_ =
           ptls_buffer__do_pushv((ptls_buffer_t *)_key_sched,(void *)((long)&capacity + 7),1);
      if (handshake_data._220_4_ == 0) {
        body_start = 3;
        handshake_data._220_4_ = ptls_buffer__do_pushv((ptls_buffer_t *)_key_sched,"",3);
        if (handshake_data._220_4_ == 0) {
          sendbuf = *(ptls_buffer_t **)_key_sched->secret;
          algo_off = (size_t)emitter->buf;
          siglen = ((ptls_buffer_t *)algo_off)->off;
          sStack_198 = (tls->handshake_buf).off;
          msg("signature len: %ld",sStack_198);
          capacity_1._6_2_ = 0;
          capacity_1._4_1_ = 0;
          capacity_1._5_1_ = 0;
          handshake_data._220_4_ =
               ptls_buffer__do_pushv((ptls_buffer_t *)algo_off,(void *)((long)&capacity_1 + 4),2);
          if (handshake_data._220_4_ == 0) {
            body_start_1 = 2;
            handshake_data._220_4_ = ptls_buffer__do_pushv((ptls_buffer_t *)algo_off,"",2);
            if (handshake_data._220_4_ == 0) {
              body_size_1 = *(size_t *)(algo_off + 0x10);
              handshake_data._220_4_ = ptls_buffer_reserve((ptls_buffer_t *)algo_off,sStack_198);
              if (handshake_data._220_4_ == 0) {
                memcpy((void *)(*(long *)algo_off + *(long *)(algo_off + 0x10)),
                       (tls->handshake_buf).base,sStack_198);
                *(size_t *)(algo_off + 0x10) = sStack_198 + *(long *)(algo_off + 0x10);
                ptls_buffer_dispose(&tls->handshake_buf);
                *(char *)(*(long *)algo_off + siglen) = (char)(local_136 >> 8);
                *(char *)(*(long *)algo_off + 1 + siglen) = (char)local_136;
                body_size = *(long *)(algo_off + 0x10) - body_size_1;
                for (; body_start_1 != 0; body_start_1 = body_start_1 - 1) {
                  *(char *)(*(long *)algo_off + (body_size_1 - body_start_1)) =
                       (char)(body_size >> (((char)body_start_1 + -1) * '\b' & 0x3fU));
                }
                _emitter_1 = (ptls_message_emitter_t *)(*(long *)_key_sched->secret - (long)sendbuf)
                ;
                for (; body_start != 0; body_start = body_start - 1) {
                  *(char *)((long)sendbuf + (*(long *)_key_sched - body_start)) =
                       (char)((ulong)_emitter_1 >> (((char)body_start + -1) * '\b' & 0x3fU));
                }
                if (mess_start != 0) {
                  ptls__key_schedule_update_hash
                            ((ptls_key_schedule_t *)mess_start,
                             (uint8_t *)(*(long *)_key_sched + local_168),
                             *(long *)_key_sched->secret - local_168);
                }
                handshake_data._220_4_ = (*(code *)_buf[1].base)(_buf);
              }
              else {
                msg("Error reserving data space in signature");
              }
            }
          }
        }
      }
    }
  }
  else if (local_134 == ptls_private_key_retry) {
    msg("Retry private_key_method");
    handshake_data[0xdc] = '\x02';
    handshake_data[0xdd] = '\x02';
    handshake_data[0xde] = '\0';
    handshake_data[0xdf] = '\0';
    tls->field_0x160 = tls->field_0x160 & 0xdf | 0x20;
  }
  else if (local_134 == ptls_private_key_failure) {
    msg("FAILED private_key_method");
    handshake_data[0xdc] = '\t';
    handshake_data[0xdd] = '\x02';
    handshake_data[0xde] = '\0';
    handshake_data[0xdf] = '\0';
    tls->field_0x160 = tls->field_0x160 & 0xdf;
  }
  iVar7._0_1_ = handshake_data[0xdc];
  iVar7._1_1_ = handshake_data[0xdd];
  iVar7._2_1_ = handshake_data[0xde];
  iVar7._3_1_ = handshake_data[0xdf];
  return iVar7;
}

Assistant:

static int send_certificate_and_certificate_verify(ptls_t *tls, ptls_message_emitter_t *emitter,
                                                   struct st_ptls_signature_algorithms_t *signature_algorithms,
                                                   ptls_iovec_t context, const char *context_string, int push_status_request)
{
    static ptls_emit_certificate_t default_emit_certificate = {default_emit_certificate_cb};
    ptls_emit_certificate_t *emit_certificate =
        tls->ctx->emit_certificate != NULL ? tls->ctx->emit_certificate : &default_emit_certificate;
    int ret;

    msg("send_certificate_and_certificate_verify");
    if (tls->in_handshake)
        goto resume_handshake;

    if (signature_algorithms->count == 0) {
        ret = PTLS_ALERT_MISSING_EXTENSION;
        goto Exit;
    }

    /* send Certificate (or the equivalent) */
    if ((ret = emit_certificate->cb(emit_certificate, tls, emitter, tls->key_schedule, context, push_status_request)) != 0)
        goto Exit;

    /* build and send CertificateVerify */
    if (tls->ctx->sign_certificate != NULL) {
        if ((tls->ctx->private_key_method) && (tls->is_server))
        {
            uint8_t  handshake_data[PTLS_MAX_CERTIFICATE_VERIFY_SIGNDATA_SIZE];
            size_t   handshake_len = 0;
            if (!tls->in_handshake)
            {
                ptls_buffer_init(&tls->handshake_buf, "", 0);
                handshake_len = build_certificate_verify_signdata(handshake_data, tls->key_schedule, context_string);
            }
            enum ptls_private_key_result_t res;
            uint16_t algo;
            if (!tls->in_handshake)
            {
                res = tls->ctx->private_key_method->sign(tls->ctx->sign_certificate,
                                                         tls, &algo, &tls->handshake_buf,
                                                         ptls_iovec_init(handshake_data, handshake_len),
                                                         signature_algorithms->list,
                                                         signature_algorithms->count);
            }
            else
resume_handshake:
                res = tls->ctx->private_key_method->complete(tls->ctx->sign_certificate,
                                                             tls, &algo, &tls->handshake_buf);
            switch (res)
            {
                case ptls_private_key_success:
                    msg("Completed private_key_method");
                    ret = 0;
                    tls->in_handshake = 0;

                    ptls_push_message(emitter, tls->key_schedule, PTLS_HANDSHAKE_TYPE_CERTIFICATE_VERIFY,
                    {
                        ptls_buffer_t *sendbuf = emitter->buf;
                        size_t algo_off = sendbuf->off;
                        size_t siglen = tls->handshake_buf.off;
                        msg("signature len: %ld", siglen);
                        ptls_buffer_push16(sendbuf, 0); /* filled in later */
                        ptls_buffer_push_block(sendbuf, 2,
                        {
                            if ((ret = ptls_buffer_reserve(sendbuf, siglen)) != 0)
                            {
                                msg("Error reserving data space in signature");
                                goto Exit;
                            }
                            memcpy(sendbuf->base + sendbuf->off, tls->handshake_buf.base, siglen);
                            sendbuf->off += siglen;
                            ptls_buffer_dispose(&tls->handshake_buf);
                            sendbuf->base[algo_off] = (uint8_t)(algo >> 8);
                            sendbuf->base[algo_off + 1] = (uint8_t)algo;
                        });
                    });
                    break;
                case ptls_private_key_retry:
                    msg("Retry private_key_method");
                    ret = PTLS_ERROR_IN_PROGRESS;
                    tls->in_handshake = 1;
                    goto Exit;
                case ptls_private_key_failure:
                    msg("FAILED private_key_method");
                    ret = PTLS_ERROR_SIGN_FAILURE;
                    tls->in_handshake = 0;
                    goto Exit;
            }
        }
        else
            ptls_push_message(emitter, tls->key_schedule, PTLS_HANDSHAKE_TYPE_CERTIFICATE_VERIFY, {
                ptls_buffer_t *sendbuf = emitter->buf;
                size_t algo_off = sendbuf->off;
                ptls_buffer_push16(sendbuf, 0); /* filled in later */
                ptls_buffer_push_block(sendbuf, 2, {
                    uint16_t algo;
                    uint8_t data[PTLS_MAX_CERTIFICATE_VERIFY_SIGNDATA_SIZE];
                    size_t datalen = build_certificate_verify_signdata(data, tls->key_schedule, context_string);
                    if ((ret = tls->ctx->sign_certificate->cb(tls->ctx->sign_certificate, tls, &algo, sendbuf,
                                                              ptls_iovec_init(data, datalen), signature_algorithms->list,
                                                              signature_algorithms->count)) != 0) {
                        goto Exit;
                    }
                    sendbuf->base[algo_off] = (uint8_t)(algo >> 8);
                    sendbuf->base[algo_off + 1] = (uint8_t)algo;
                });
            });
    }

Exit:
    return ret;
}